

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  BYTE *srcPtr;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ushort *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ushort *puVar18;
  BYTE *dstPtr;
  BYTE *s_1;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  BYTE *d_1;
  char *pcVar22;
  char *pcVar23;
  BYTE *d;
  ulong uVar24;
  int iVar25;
  BYTE *s;
  ushort *puVar26;
  ushort *__src;
  ushort *puVar27;
  
  iVar25 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar25 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      lVar15 = (long)maxOutputSize;
      puVar27 = (ushort *)source;
      if (0x3f < maxOutputSize) {
        lVar14 = 0;
LAB_00112b0e:
        pcVar22 = dest + lVar14;
        __src = (ushort *)((long)puVar27 + 1);
        bVar4 = (byte)*puVar27;
        uVar9 = (uint)bVar4;
        uVar24 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00112ffd;
          puVar18 = puVar27 + 1;
          uVar17 = 0;
          puVar27 = puVar27 + 8;
          do {
            puVar26 = __src;
            puVar13 = puVar27;
            __src = (ushort *)((long)puVar26 + 1);
            uVar17 = uVar17 + *(byte *)((long)puVar13 + -0xf);
            puVar18 = (ushort *)((long)puVar18 + 1);
            puVar27 = (ushort *)((long)puVar13 + 1);
          } while (puVar13 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar13 + -0xf) == 0xff);
          uVar24 = (ulong)uVar17 + 0xf;
          if ((CARRY8((ulong)pcVar22,uVar24)) || ((ulong)-(long)puVar18 < uVar24)) {
            __src = puVar13 + -7;
            goto LAB_00112ffd;
          }
          lVar16 = lVar14 + uVar24;
          if (dest + lVar15 + -0x20 < dest + lVar16) goto LAB_00112e13;
          puVar27 = (ushort *)((ulong)uVar17 + (long)puVar13 + 1);
          if (puVar1 + -0x10 < puVar27) {
            __src = puVar13 + -7;
            goto LAB_00112e13;
          }
          lVar14 = 0;
          do {
            uVar7 = *(undefined8 *)((byte *)((long)__src + lVar14) + 8);
            pcVar2 = pcVar22 + lVar14;
            *(undefined8 *)pcVar2 = *(undefined8 *)((long)__src + lVar14);
            *(undefined8 *)(pcVar2 + 8) = uVar7;
            pbVar3 = (byte *)((long)puVar26 + lVar14 + 0x11);
            uVar7 = *(undefined8 *)(pbVar3 + 8);
            *(undefined8 *)(pcVar2 + 0x10) = *(undefined8 *)pbVar3;
            *(undefined8 *)(pcVar2 + 0x18) = uVar7;
            lVar14 = lVar14 + 0x20;
          } while (pcVar2 + 0x20 < dest + lVar16);
        }
        else {
          lVar16 = lVar14 + uVar24;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_00112e13;
          uVar7 = *(undefined8 *)((long)puVar27 + 9);
          *(undefined8 *)pcVar22 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar22 + 8) = uVar7;
          puVar27 = (ushort *)(uVar24 + (long)__src);
        }
        dstPtr = (BYTE *)(dest + lVar16);
        uVar6 = *puVar27;
        uVar24 = (ulong)uVar6;
        uVar17 = (uint)uVar6;
        puVar27 = puVar27 + 1;
        lVar19 = lVar16 - uVar24;
        srcPtr = (BYTE *)(dest + lVar19);
        uVar11 = (ulong)(bVar4 & 0xf);
        if (uVar11 == 0xf) {
          __src = puVar27;
          if (lVar19 < -0x10000) goto LAB_00112ffd;
          uVar9 = 0;
          puVar18 = puVar27;
          do {
            puVar27 = (ushort *)((long)puVar18 + 1);
            __src = puVar27;
            if (puVar1 + -2 <= puVar27) goto LAB_00112ffd;
            uVar8 = *puVar18;
            uVar9 = uVar9 + (byte)uVar8;
            puVar18 = puVar27;
          } while ((byte)uVar8 == 0xff);
          uVar10 = (ulong)uVar9;
          if ((BYTE *)(-0x10 - uVar10) < dstPtr) goto LAB_00112ffd;
          uVar11 = uVar10 + 0x13;
          if (dest + lVar15 + -0x40 <= dstPtr + uVar10 + 0x13) goto LAB_00112eba;
LAB_00112cae:
          __src = puVar27;
          if (lVar19 < -0x10000) goto LAB_00112ffd;
          lVar14 = lVar16 + uVar11;
          if (uVar6 < 0x10) {
            LZ4_memcpy_using_offset(dstPtr,srcPtr,(BYTE *)(dest + lVar14),uVar24);
          }
          else {
            do {
              uVar7 = *(undefined8 *)(dstPtr + -uVar24 + 8);
              *(undefined8 *)dstPtr = *(undefined8 *)(dstPtr + -uVar24);
              *(undefined8 *)(dstPtr + 8) = uVar7;
              uVar7 = *(undefined8 *)(dstPtr + -uVar24 + 0x10 + 8);
              *(undefined8 *)(dstPtr + 0x10) = *(undefined8 *)(dstPtr + -uVar24 + 0x10);
              *(undefined8 *)(dstPtr + 0x18) = uVar7;
              dstPtr = dstPtr + 0x20;
            } while (dstPtr < dest + lVar14);
          }
        }
        else {
          lVar14 = lVar16 + uVar11 + 4;
          uVar11 = uVar11 + 4;
          uVar17 = (uint)uVar6;
          if (dest + lVar15 + -0x40 <= dest + lVar14) goto LAB_00112eba;
          if (uVar6 < 8) goto LAB_00112cae;
          *(undefined8 *)dstPtr = *(undefined8 *)srcPtr;
          *(undefined8 *)(dstPtr + 8) = *(undefined8 *)(srcPtr + 8);
          *(undefined2 *)(dstPtr + 0x10) = *(undefined2 *)(srcPtr + 0x10);
        }
        goto LAB_00112b0e;
      }
      lVar16 = 0;
      do {
        while( true ) {
          pcVar22 = dest + lVar16;
          __src = (ushort *)((long)puVar27 + 1);
          bVar4 = (byte)*puVar27;
          uVar9 = (uint)bVar4;
          uVar24 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + lVar15 + -0x20 < pcVar22))
          goto LAB_00112e10;
          uVar7 = *(undefined8 *)((long)puVar27 + 9);
          *(undefined8 *)pcVar22 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar22 + 8) = uVar7;
          lVar16 = lVar16 + uVar24;
          uVar11 = (ulong)(bVar4 & 0xf);
          puVar27 = (ushort *)((long)__src + uVar24) + 1;
          uVar6 = *(ushort *)((long)__src + uVar24);
          uVar17 = (uint)uVar6;
          lVar19 = lVar16 - (ulong)uVar6;
          if ((uVar11 == 0xf) || (uVar6 < 8)) goto LAB_00112e5e;
          *(undefined8 *)(dest + lVar16) = *(undefined8 *)(dest + lVar19);
          *(undefined8 *)(dest + lVar16 + 8) = *(undefined8 *)(dest + lVar19 + 8);
          *(undefined2 *)(dest + lVar16 + 0x10) = *(undefined2 *)(dest + lVar19 + 0x10);
          lVar16 = lVar16 + uVar11 + 4;
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00112ffd;
        puVar27 = puVar27 + 1;
        uVar17 = 0;
        do {
          uVar6 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar17 = uVar17 + (byte)uVar6;
          puVar27 = (ushort *)((long)puVar27 + 1);
        } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
        uVar24 = (ulong)uVar17 + 0xf;
        if ((CARRY8((ulong)pcVar22,uVar24)) || ((ulong)-(long)puVar27 < uVar24)) goto LAB_00112ffd;
LAB_00112e10:
        lVar16 = lVar16 + uVar24;
LAB_00112e13:
        puVar18 = (ushort *)((long)__src + uVar24);
        if ((dest + lVar15 + -0xc < dest + lVar16) || (puVar1 + -4 < puVar18)) {
          if ((puVar18 == puVar1) && (lVar16 <= lVar15)) {
            memmove(pcVar22,__src,uVar24);
            return ((int)pcVar22 + (int)uVar24) - (int)dest;
          }
LAB_00112ffd:
          return ~(uint)__src + (int)source;
        }
        do {
          *(undefined8 *)pcVar22 = *(undefined8 *)__src;
          pcVar22 = pcVar22 + 8;
          __src = __src + 4;
        } while (pcVar22 < dest + lVar16);
        uVar17 = (uint)*puVar18;
        puVar27 = puVar18 + 1;
        lVar19 = lVar16 - (ulong)*puVar18;
        uVar11 = (ulong)(uVar9 & 0xf);
LAB_00112e5e:
        if ((int)uVar11 == 0xf) {
          uVar9 = 0;
          do {
            uVar6 = *puVar27;
            puVar27 = (ushort *)((long)puVar27 + 1);
            uVar9 = uVar9 + (byte)uVar6;
          } while ((byte)uVar6 == 0xff && puVar27 < puVar1 + -2);
          uVar11 = (ulong)uVar9 + 0xf;
          __src = puVar27;
          if ((puVar1 + -2 <= puVar27) || (CARRY8((ulong)(dest + lVar16),uVar11)))
          goto LAB_00112ffd;
        }
        uVar11 = uVar11 + 4;
LAB_00112eba:
        __src = puVar27;
        if (lVar19 < -0x10000) goto LAB_00112ffd;
        pcVar22 = dest + lVar16;
        pcVar20 = dest + lVar19;
        lVar16 = lVar16 + uVar11;
        pcVar2 = dest + lVar16;
        if (uVar17 < 8) {
          pcVar22[0] = '\0';
          pcVar22[1] = '\0';
          pcVar22[2] = '\0';
          pcVar22[3] = '\0';
          *pcVar22 = *pcVar20;
          pcVar22[1] = pcVar20[1];
          pcVar22[2] = pcVar20[2];
          pcVar22[3] = pcVar20[3];
          uVar24 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar17 << 2));
          *(undefined4 *)(pcVar22 + 4) = *(undefined4 *)(pcVar20 + uVar24);
          pcVar20 = pcVar20 + (uVar24 - (long)*(int *)((long)dec64table + (ulong)(uVar17 << 2)));
        }
        else {
          *(undefined8 *)pcVar22 = *(undefined8 *)pcVar20;
          pcVar20 = pcVar20 + 8;
        }
        pcVar12 = pcVar22 + 8;
        if (dest + lVar15 + -0xc < pcVar2) {
          if (dest + lVar15 + -5 < pcVar2) goto LAB_00112ffd;
          pcVar22 = dest + lVar15 + -7;
          pcVar21 = pcVar20;
          pcVar23 = pcVar12;
          if (pcVar12 < pcVar22) {
            do {
              *(undefined8 *)pcVar23 = *(undefined8 *)pcVar21;
              pcVar23 = pcVar23 + 8;
              pcVar21 = pcVar21 + 8;
            } while (pcVar23 < pcVar22);
            pcVar20 = pcVar20 + ((long)pcVar22 - (long)pcVar12);
            pcVar12 = pcVar22;
          }
          for (; pcVar12 < pcVar2; pcVar12 = pcVar12 + 1) {
            cVar5 = *pcVar20;
            pcVar20 = pcVar20 + 1;
            *pcVar12 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar12 = *(undefined8 *)pcVar20;
          if (0x10 < uVar11) {
            pcVar22 = pcVar22 + 0x10;
            do {
              pcVar20 = pcVar20 + 8;
              *(undefined8 *)pcVar22 = *(undefined8 *)pcVar20;
              pcVar22 = pcVar22 + 8;
            } while (pcVar22 < pcVar2);
          }
        }
      } while( true );
    }
  }
  return iVar25;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}